

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

bit_cost_t __thiscall
lzham::lzcompressor::state::get_len2_match_cost
          (state *this,CLZBase *lzbase,uint dict_pos,uint len2_match_dist,uint is_match_model_index)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint match_extra;
  uint match_slot;
  uint local_30;
  uint local_2c;
  
  uVar2 = *(uint *)(gProbCost +
                   (ulong)(0x800 - *(ushort *)
                                    ((long)(&this->super_state_base + 1) +
                                    (ulong)is_match_model_index * 2 + 4)) * 4);
  uVar3 = *(uint *)(gProbCost +
                   (ulong)*(ushort *)
                           ((long)this->m_lit_table +
                           (ulong)(this->super_state_base).m_cur_state * 2 + -0x7c) * 4);
  CLZBase::compute_lzx_position_slot(lzbase,len2_match_dist,&local_2c,&local_30);
  bVar1 = (lzbase->super_CLZDecompBase).m_lzx_position_extra_bits[local_2c];
  if (bVar1 < 3) {
    lVar4 = (ulong)bVar1 << 0x18;
  }
  else {
    uVar5 = 0;
    if (4 < bVar1) {
      uVar5 = (ulong)((uint)bVar1 * 0x1000000 + 0xfc000000);
    }
    lVar4 = (long)(int)((uint)(this->m_dist_lsb_table).super_raw_quasi_adaptive_huffman_data_model.
                              m_code_sizes.m_p[local_30 & 0xf] << 0x18) + uVar5;
  }
  return (long)(int)((uint)(this->m_main_table).super_raw_quasi_adaptive_huffman_data_model.
                           m_code_sizes.m_p[local_2c * 8 - 6] << 0x18) + (ulong)uVar2 + (ulong)uVar3
         + lVar4;
}

Assistant:

bit_cost_t lzcompressor::state::get_len2_match_cost(CLZBase& lzbase, uint dict_pos, uint len2_match_dist, uint is_match_model_index)
   {
      dict_pos;

      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(1);

      cost += m_is_rep_model[m_cur_state].get_cost(0);

      // full match
      uint match_slot, match_extra;
      lzbase.compute_lzx_position_slot(len2_match_dist, match_slot, match_extra);

      const uint match_len = 2;
      uint match_low_sym = match_len - 2;

      uint match_high_sym = 0;

      LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
      match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

      uint main_sym = match_low_sym | (match_high_sym << 3);

      cost += m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);

      uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
      if (num_extra_bits < 3)
         cost += (num_extra_bits << cBitCostScaleShift);
      else
      {
         if (num_extra_bits > 4)
            cost += ((num_extra_bits - 4) << cBitCostScaleShift);

         cost += m_dist_lsb_table.get_cost(match_extra & 15);
      }

      return cost;
   }